

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_application_info_link
          (Impl *this,StateCreatorInterface *iface,Value *link)

{
  Type pGVar1;
  Ch *pCVar2;
  ulonglong uVar3;
  ulonglong uVar4;
  ulong uVar5;
  
  pGVar1 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)link,"application");
  pCVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(pGVar1);
  uVar3 = strtoull(pCVar2,(char **)0x0,0x10);
  pGVar1 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)link,"tag");
  if ((undefined1  [16])((undefined1  [16])pGVar1->data_ & (undefined1  [16])0x20000000000000) !=
      (undefined1  [16])0x0) {
    uVar5 = (ulong)(pGVar1->data_).s.length;
    pGVar1 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)link,"hash");
    pCVar2 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(pGVar1);
    uVar4 = strtoull(pCVar2,(char **)0x0,0x10);
    (*iface->_vptr_StateCreatorInterface[4])
              (iface,(uVar4 & 0xffffffff ^
                     (((uVar3 & 0xffffffff ^ 0xaf63bd4c8601b7df) * 0x100000001b3 ^ uVar3 >> 0x20) *
                      0x100000001b3 ^ uVar5) * 0x100000001b3) * 0x100000001b3 ^ uVar4 >> 0x20,uVar3,
               uVar5,uVar4);
    return true;
  }
  __assert_fail("data_.f.flags & kIntFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x718,
                "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_application_info_link(StateCreatorInterface &iface, const Value &link)
{
	Hash application_hash = string_to_uint64(link["application"].GetString());
	auto tag = static_cast<ResourceTag>(link["tag"].GetInt());
	Hash hash = string_to_uint64(link["hash"].GetString());
	Hash link_hash = Hashing::compute_hash_application_info_link(application_hash, tag, hash);
	iface.notify_application_info_link(link_hash, application_hash, tag, hash);
	return true;
}